

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O2

string * __thiscall
wabt::LoadStoreTracking::GenAlign_abi_cxx11_
          (string *__return_storage_ptr__,LoadStoreTracking *this,Address align,Opcode opc)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  Opcode local_3c;
  string local_38;
  
  local_3c.enum_ = opc.enum_;
  bVar1 = Opcode::IsNaturallyAligned(&local_3c,align);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_38);
  }
  else {
    std::__cxx11::to_string(&local_38,align);
    cat<char[2],std::__cxx11::string>
              (__return_storage_ptr__,(wabt *)"@",(char (*) [2])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_0000000c,opc.enum_));
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenAlign(Address align, Opcode opc) const {
    return opc.IsNaturallyAligned(align) ? "" : cat("@", std::to_string(align));
  }